

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O1

_Bool adt_bytearray_data_equals(adt_bytearray_t *self,uint8_t *data,uint32_t dataLen)

{
  uint uVar1;
  int iVar2;
  _Bool _Var3;
  
  _Var3 = self == (adt_bytearray_t *)0x0;
  if (data != (uint8_t *)0x0 && !_Var3) {
    uVar1 = self->u32CurLen;
    if (uVar1 == dataLen) {
      if ((ulong)uVar1 == 0) {
        _Var3 = true;
      }
      else {
        iVar2 = bcmp(self->pData,data,(ulong)uVar1);
        _Var3 = iVar2 == 0;
      }
    }
    if (uVar1 == dataLen) {
      return _Var3;
    }
  }
  return false;
}

Assistant:

bool adt_bytearray_data_equals(const adt_bytearray_t* self, const uint8_t* data, uint32_t dataLen)
{
   if ( (self != 0) && (data != 0) )
   {
      uint32_t myLen;
      myLen = adt_bytearray_length(self);
      if (myLen == dataLen)
      {
         const uint8_t* myData = self->pData;
         if (myLen == 0u)
         {
            return true;
         }
         else
         {
            return (memcmp(myData, data, myLen) == 0) ? true : false;
         }
      }
   }
   return false;
}